

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

array<int,_8UL> *
dgrminer::smallerDirectionOfAdjacencyInfo
          (array<int,_8UL> *__return_storage_ptr__,array<int,_8UL> *adjacencyinfo)

{
  int iVar1;
  reference pvVar2;
  int local_34;
  undefined1 auStack_30 [4];
  int i;
  array<int,_8UL> flipped;
  array<int,_8UL> *adjacencyinfo_local;
  
  flipped._M_elems._24_8_ = adjacencyinfo;
  flipAdjacencyInfo((array<int,_8UL> *)auStack_30,adjacencyinfo);
  local_34 = 0;
  while( true ) {
    if (7 < local_34) {
      *(undefined8 *)__return_storage_ptr__->_M_elems = *(undefined8 *)flipped._M_elems._24_8_;
      *(undefined8 *)(__return_storage_ptr__->_M_elems + 2) =
           *(undefined8 *)(flipped._M_elems._24_8_ + 8);
      *(undefined8 *)(__return_storage_ptr__->_M_elems + 4) =
           *(undefined8 *)(flipped._M_elems._24_8_ + 0x10);
      *(undefined8 *)(__return_storage_ptr__->_M_elems + 6) =
           *(undefined8 *)(flipped._M_elems._24_8_ + 0x18);
      return __return_storage_ptr__;
    }
    pvVar2 = std::array<int,_8UL>::operator[]
                       ((array<int,_8UL> *)flipped._M_elems._24_8_,(long)local_34);
    iVar1 = *pvVar2;
    pvVar2 = std::array<int,_8UL>::operator[]((array<int,_8UL> *)auStack_30,(long)local_34);
    if (iVar1 < *pvVar2) break;
    pvVar2 = std::array<int,_8UL>::operator[]
                       ((array<int,_8UL> *)flipped._M_elems._24_8_,(long)local_34);
    iVar1 = *pvVar2;
    pvVar2 = std::array<int,_8UL>::operator[]((array<int,_8UL> *)auStack_30,(long)local_34);
    if (*pvVar2 < iVar1) {
      *(undefined8 *)__return_storage_ptr__->_M_elems = _auStack_30;
      *(undefined8 *)(__return_storage_ptr__->_M_elems + 2) = flipped._M_elems._0_8_;
      *(undefined8 *)(__return_storage_ptr__->_M_elems + 4) = flipped._M_elems._8_8_;
      *(undefined8 *)(__return_storage_ptr__->_M_elems + 6) = flipped._M_elems._16_8_;
      return __return_storage_ptr__;
    }
    local_34 = local_34 + 1;
  }
  *(undefined8 *)__return_storage_ptr__->_M_elems = *(undefined8 *)flipped._M_elems._24_8_;
  *(undefined8 *)(__return_storage_ptr__->_M_elems + 2) =
       *(undefined8 *)(flipped._M_elems._24_8_ + 8);
  *(undefined8 *)(__return_storage_ptr__->_M_elems + 4) =
       *(undefined8 *)(flipped._M_elems._24_8_ + 0x10);
  *(undefined8 *)(__return_storage_ptr__->_M_elems + 6) =
       *(undefined8 *)(flipped._M_elems._24_8_ + 0x18);
  return __return_storage_ptr__;
}

Assistant:

std::array<int, 8> smallerDirectionOfAdjacencyInfo(std::array<int, 8> &adjacencyinfo)
    {

        std::array<int, 8> flipped = flipAdjacencyInfo(adjacencyinfo);
        for (int i = 0; i < 8; i++)
        {
            if (adjacencyinfo[i] < flipped[i])
            {
                return adjacencyinfo;
            }
            else if (adjacencyinfo[i] > flipped[i])
            {
                return flipped;
            }
        }
        return adjacencyinfo;
    }